

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * step_abi_cxx11_(string *__return_storage_ptr__,field_t *f,pos_t *s,bool *back,bool *explore
                        )

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  pointer piVar4;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int y;
  uint uVar11;
  long lVar12;
  int iVar13;
  pointer pvVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  pointer pvVar19;
  bool bVar20;
  int x;
  size_type __n;
  long lVar21;
  value_type_conflict local_b4;
  string *local_b0;
  undefined1 local_a8 [8];
  way_t ways;
  ulong local_80;
  undefined1 local_68 [8];
  way_t wc;
  ulong local_48;
  ulong local_40;
  allocator_type local_36;
  allocator_type local_35;
  uint local_34;
  
  __n = (size_type)R;
  local_b4 = 0;
  ways.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)s;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,(long)C,&local_b4,&local_36);
  local_b0 = __return_storage_ptr__;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_a8,__n,(value_type *)local_68,&local_35);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_68);
  (((pointer)
   ((long)local_a8 +
   (long)*(int *)&((ways.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start * 0x18))->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start
  [*(int *)((long)&((ways.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                   _M_start + 4)] = 1;
  local_34 = 0xffffffff;
  local_80 = 0xffffffff;
  local_40 = 0xffffffffffffffff;
  local_48 = 0xffffffff;
  do {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_68,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_a8);
    bVar18 = 0;
    wc.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar2 = 0;
    while (uVar16 = uVar2, (long)uVar16 < (long)R) {
      uVar2 = uVar16 + 1;
      for (uVar17 = 0; (long)uVar17 < (long)C; uVar17 = uVar17 + 1) {
        piVar4 = (((pointer)((long)local_a8 + uVar16 * 0x18))->
                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
        iVar3 = piVar4[uVar17];
        if (iVar3 == 0) {
          uVar11 = *(uint *)(*(long *)&(f->
                                       super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar16].
                                       super__Vector_base<ECell,_std::allocator<ECell>_>._M_impl.
                                       super__Vector_impl_data + uVar17 * 4);
          poVar7 = (ostream *)(ulong)uVar11;
          if ((uVar11 - 0x2e < 0x27) &&
             ((0x4000220001U >> ((ulong)(uVar11 - 0x2e) & 0x3f) & 1) != 0)) {
            if ((uVar16 != 0) &&
               (0 < (((pointer)((long)local_a8 + (uVar16 - 1) * 0x18))->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start[uVar17])) {
              (((pointer)((long)local_68 + uVar16 * 0x18))->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[uVar17] = 1;
              bVar18 = 1;
            }
            if (((int)uVar2 < R) &&
               (0 < (((pointer)((long)local_a8 + uVar2 * 0x18))->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start[uVar17])) {
              (((pointer)((long)local_68 + uVar16 * 0x18))->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[uVar17] = 1;
              bVar18 = 1;
            }
            if ((uVar17 != 0) && (0 < piVar4[uVar17 - 1])) {
              (((pointer)((long)local_68 + uVar16 * 0x18))->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[uVar17] = 1;
              bVar18 = 1;
            }
            if (((int)uVar17 + 1 < C) && (0 < piVar4[uVar17 + 1])) {
              (((pointer)((long)local_68 + uVar16 * 0x18))->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[uVar17] = 1;
              bVar18 = 1;
            }
            if ((((pointer)((long)local_68 + uVar16 * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[uVar17] == 1) {
              if (*back == true) {
                if (uVar11 == 0x54) {
LAB_00103580:
                  wc.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT71((int7)((ulong)poVar7 >> 8),1);
                  local_48 = uVar17 & 0xffffffff;
                  local_34 = (uint)uVar16;
                }
              }
              else if (uVar11 == 0x43) {
                local_40 = uVar16 & 0xffffffff;
                local_80 = uVar17 & 0xffffffff;
              }
              else if ((uVar11 == 0x3f) && (*explore != false)) {
                poVar7 = std::operator<<((ostream *)&std::cerr,"move to ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)uVar16);
                poVar7 = std::operator<<(poVar7,", ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar17);
                poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
                goto LAB_00103580;
              }
            }
          }
        }
        else if (0 < iVar3) {
          (((pointer)((long)local_68 + uVar16 * 0x18))->
          super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
          [uVar17] = iVar3 + 1;
        }
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_a8,
                (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_68);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_68);
  } while (((~bVar18 |
            (byte)wc.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) & 1) == 0);
  bVar18 = *explore;
  if ((((ulong)wc.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) && ((bVar18 & 1) != 0))
  {
    *explore = false;
    bVar18 = 0;
  }
  local_40 = local_40 & 0xffffffff;
  if (((bVar18 | *back) & 1) != 0) {
    local_40 = (ulong)local_34;
    local_80 = local_48;
  }
  for (lVar12 = 0; psVar6 = local_b0, lVar12 < R; lVar12 = lVar12 + 1) {
    for (lVar21 = 0; lVar21 < C; lVar21 = lVar21 + 1) {
      *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 3;
      std::ostream::operator<<
                ((ostream *)&std::cerr,
                 (((pointer)((long)local_a8 + lVar12 * 0x18))->
                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start[lVar21]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  if ((int)local_40 == -1) {
    __assert_fail("-1 != e.first",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                  ,0x7e,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
  }
  local_34 = *(uint *)&((ways.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
  iVar3 = *(int *)((long)&((ways.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + 4);
  bVar20 = true;
  wc.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(wc.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,C);
  do {
    iVar13 = (int)local_40;
    iVar8 = iVar13 - local_34;
    iVar5 = -iVar8;
    if (0 < iVar8) {
      iVar5 = iVar8;
    }
    pvVar14 = (pointer)((long)local_a8 + local_40 * 0x18);
    local_40 = (ulong)(iVar13 - 1);
    uVar11 = iVar13 + 1;
    pvVar19 = (pointer)((long)local_a8 + (long)iVar13 * 0x18);
LAB_001036ea:
    iVar9 = (int)local_80;
    iVar10 = iVar9 - iVar3;
    iVar8 = -iVar10;
    if (0 < iVar10) {
      iVar8 = iVar10;
    }
    if ((uint)(iVar8 + iVar5) < 2) {
      if (bVar20) {
        *back = true;
      }
      if (iVar13 < (int)local_34) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b0,"UP",(allocator<char> *)local_68);
      }
      else if ((int)local_34 < iVar13) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b0,"DOWN",(allocator<char> *)local_68);
      }
      else if (iVar9 < iVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b0,"LEFT",(allocator<char> *)local_68);
      }
      else {
        if (iVar9 <= iVar3) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                        ,0xad,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b0,"RIGHT",(allocator<char> *)local_68);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_a8);
      return psVar6;
    }
    if ((iVar13 < 1) ||
       ((((pointer)((long)local_a8 + local_40 * 0x18))->
        super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
        [iVar9] <=
        (pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[iVar9])) {
      if ((R <= (int)uVar11) ||
         ((((pointer)((long)local_a8 + (long)(int)uVar11 * 0x18))->
          super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
          [iVar9] <=
          (pvVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[iVar9])) {
        if (0 < iVar9) break;
        goto LAB_0010374f;
      }
      local_40 = (ulong)uVar11;
    }
    bVar20 = false;
  } while( true );
  piVar4 = (pvVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = piVar4 + local_80;
  local_80 = (ulong)(iVar9 - 1);
  bVar20 = false;
  if (piVar4[local_80] <= *piVar1) {
LAB_0010374f:
    uVar15 = iVar9 + 1;
    if ((int)uVar15 < C) {
      piVar4 = (pvVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar20 = false;
      local_80 = (ulong)uVar15;
      if (piVar4[iVar9] < piVar4[(int)uVar15]) goto LAB_001036ea;
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                  ,0x96,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
  }
  goto LAB_001036ea;
}

Assistant:

std::string step(const field_t& f, const pos_t& s, bool& back, bool& explore)
{
    bool step_taken;
    bool found_way = false;
    way_t ways(R, wrow_t(C, 0));
    ways[s.first][s.second] = 1;
    pos_t e(-1, -1);
    pos_t c(-1, -1);
    do
    {
        step_taken = false;
        way_t wc = ways; 
        for (int y = 0; y < R; y++)
        {
            for (int x = 0; x < C; x++)
            {
                if (0 == ways[y][x]
                    && (EC_HOLLOW == f[y][x]
                        || EC_CONTROL == f[y][x]
                        || EC_START == f[y][x]
                        || EC_UNKNOWN == f[y][x]))
                {
                    if (0 < y && 0 < ways[y - 1][x])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (R > y + 1 && 0 < ways[y + 1][x])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (0 < x && 0 < ways[y][x - 1])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (C > x + 1 && 0 < ways[y][x + 1])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (1 == wc[y][x])
                    {
                        if (back)
                        {
                            if (EC_START == f[y][x])
                            {
                                found_way = true;
                                e = pos_t(y, x);
                            }
                        }
                        else
                        {
                            if (EC_CONTROL == f[y][x])
                            {
                                c = pos_t(y, x);
                            }
                            if (explore && EC_UNKNOWN == f[y][x])
                            {
                                found_way = true;
                                e = pos_t(y, x);
                                std::cerr << "move to " << y << ", " << x << std::endl;
                            }
                        }
                    }
                } else if (0 < ways[y][x])
                {
                    wc[y][x] = 1 + ways[y][x];
                }
            }
        }
        ways = wc;
    } while (step_taken && !found_way);
    
    if (!found_way && explore)
    {
        explore = false;
    }
    
    if (!explore && !back)
    {
        e = c;
    }
    
    for (int y = 0; y < R; y++)
    {
        for (int x = 0; x < C; x++)
        {
            std::cerr.width(3);
            std::cerr << ways[y][x];
        }
        std::cerr << std::endl;
    }

    assert(-1 != e.first);
    
    bool last_step = true;
    while (1 < abs(e.first - s.first) + abs(e.second - s.second))
    {
        //std::cerr << e.first << ", " << e.second << std::endl;
        if (0 < e.first && ways[e.first][e.second] < ways[e.first - 1][e.second])
        {
            e.first--;
        }
        else if (R > e.first + 1 && ways[e.first][e.second] < ways[e.first + 1][e.second])
        {
            e.first++;
        }
        else if (0 < e.second && ways[e.first][e.second] < ways[e.first][e.second - 1])
        {
            e.second--;
        }
        else if (C > e.second + 1 && ways[e.first][e.second] < ways[e.first][e.second + 1])
        {
            e.second++;
        }
        else
        {
            assert(false);
        }
        last_step = false;
    }
    
    if (last_step)
    {
        back = true;
    }
    if (e.first < s.first)
    {
        return "UP";
    } else if (e.first > s.first)
    {
        return "DOWN";
    } else if (e.second < s.second)
    {
        return "LEFT";
    } else if (e.second > s.second)
    {
        return "RIGHT";
    }
    
    assert(false);
}